

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O1

void __thiscall Mempool::mem_init(Mempool *this,MEM_CAP size,int chunk_num)

{
  MEM_CAP MVar1;
  Chunk *pCVar2;
  mapped_type *ppCVar3;
  int iVar4;
  mapped_type pCVar5;
  MEM_CAP local_3c;
  MEM_CAP local_38;
  MEM_CAP local_34;
  
  pCVar2 = (Chunk *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (pCVar2 == (Chunk *)0x0) {
    pCVar2 = (Chunk *)0x0;
  }
  else {
    Chunk::Chunk(pCVar2,size);
  }
  local_34 = size;
  ppCVar3 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&local_34);
  *ppCVar3 = pCVar2;
  local_38 = size;
  ppCVar3 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&local_38);
  if (*ppCVar3 != (mapped_type)0x0) {
    local_3c = size;
    ppCVar3 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_3c);
    if (1 < chunk_num) {
      iVar4 = chunk_num + -1;
      pCVar5 = *ppCVar3;
      do {
        pCVar2 = (Chunk *)operator_new(0x20);
        Chunk::Chunk(pCVar2,size);
        pCVar5->next = pCVar2;
        iVar4 = iVar4 + -1;
        pCVar5 = pCVar2;
      } while (iVar4 != 0);
    }
    MVar1 = size + 0x3ff;
    if (-1 < (int)size) {
      MVar1 = size;
    }
    this->mp_total_size_kb = this->mp_total_size_kb + (long)(((int)MVar1 >> 10) * chunk_num);
    return;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] new chunk %d error","error","mem_init",0xb,size);
  }
  exit(1);
}

Assistant:

void Mempool::mem_init(MEM_CAP size, int chunk_num)
{
    Chunk *prev; 
    mp_pool[size] = new (std::nothrow) Chunk(size);
    if (mp_pool[size] == nullptr) {
        PR_ERROR("new chunk %d error", static_cast<int>(size));
        exit(1);
    }
    prev = mp_pool[size];

    for (int i = 1; i < chunk_num; i ++) {
        prev->next = new Chunk(size);
        if (prev->next == nullptr) {
            PR_ERROR("new chunk m4K error");
            exit(1);
        }
        prev = prev->next;
    }
    mp_total_size_kb += size/1024 * chunk_num;
}